

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  PFNGLUNIFORM1FPROC p_Var3;
  PFNGLUNIFORM1IPROC p_Var4;
  PFNGLUNIFORM3FVPROC p_Var5;
  int iVar6;
  int iVar7;
  int iVar8;
  GLint GVar9;
  GLFWwindow *handle;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  scene_t scene;
  int h;
  int w;
  double mouse [2];
  char *e;
  float rotationYX [16];
  float rotationY [16];
  float rotationX [16];
  float projection [16];
  float view [16];
  anon_struct_40_10_1f476928_for_mesh local_268;
  undefined8 local_238;
  undefined8 uStack_230;
  float local_228;
  float local_224;
  GLsizei local_220;
  GLsizei local_21c;
  double local_218;
  double local_210;
  undefined1 local_208 [16];
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  ImVec2 local_178;
  float local_170;
  undefined4 local_16c;
  float local_168;
  float local_164;
  float local_160;
  undefined4 local_15c;
  float local_158;
  float local_154;
  float local_150;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined4 local_13c;
  float local_138;
  float local_134;
  float local_130;
  undefined4 local_12c;
  float local_128;
  float local_124;
  float local_120;
  undefined4 local_11c;
  float local_118;
  float local_114;
  float local_110;
  undefined8 local_10c;
  undefined8 uStack_104;
  undefined4 local_fc;
  float local_f8 [13];
  float local_c4;
  float local_c0;
  undefined4 local_bc;
  float local_b8 [6];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  float local_78 [18];
  
  github111116::ConsoleLogger::info<char[10],int>(&console,(char (*) [10])"SH order:",&shorder);
  github111116::ConsoleLogger::info<char[14],char[10]>
            (&console,(char (*) [14])"shexp method:",(char (*) [10])"shexp_HYB");
  if (1 < argc) {
    github111116::ConsoleLogger::warn<char[18]>(&console,(char (*) [18])"single image mode");
  }
  glfwSetErrorCallback(error_callback);
  iVar6 = glfwInit();
  if (iVar6 != 0) {
    glfwWindowHint(0x21001,8);
    glfwWindowHint(0x21002,8);
    glfwWindowHint(0x21003,8);
    glfwWindowHint(0x21004,8);
    glfwWindowHint(0x21005,0x20);
    glfwWindowHint(0x21006,-1);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,1);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x22007,1);
    glfwWindowHint(0x2100d,4);
    glfwWindowHint(0x20003,0);
    handle = glfwCreateWindow(0x3c0,0x21c,"Spherical Harmonics Playground",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSwapInterval(0);
      ImGui_ImplGlfwGL3_Init(handle,true);
      local_268.vao = 0;
      local_268.vbo = 0;
      local_268.vertices = 0;
      local_268.max_magn = 0.0;
      local_268.program = 0;
      local_268.u_view = 0;
      local_268.u_projection = 0;
      local_268.LHtexture = 0;
      local_268.gammasize = 0;
      local_268.sqrgammasize = 0;
      initScene((scene_t *)&local_268);
      std::chrono::_V2::system_clock::now();
      do {
        iVar6 = glfwWindowShouldClose(handle);
        if (iVar6 != 0) {
LAB_0015d7f1:
          (*glad_glDeleteProgram)(local_268.program);
          (*glad_glDeleteVertexArrays)(1,&local_268.vao);
          (*glad_glDeleteBuffers)(1,&local_268.vbo);
          (*glad_glDeleteTextures)(1,&local_268.LHtexture);
          ImGui_ImplGlfwGL3_InvalidateDeviceObjects();
          ImGui::Shutdown();
          glfwDestroyWindow(handle);
          glfwTerminate();
          return 0;
        }
        glfwPollEvents();
        iVar6 = glfwGetKey(handle,0x52);
        if (iVar6 == 1) {
          (*glad_glDeleteProgram)(local_268.program);
          (*glad_glDeleteVertexArrays)(1,&local_268.vao);
          (*glad_glDeleteBuffers)(1,&local_268.vbo);
          (*glad_glDeleteTextures)(1,&local_268.LHtexture);
          initScene((scene_t *)&local_268);
        }
        ImGui_ImplGlfwGL3_NewFrame();
        pIVar2 = GImGui;
        (pIVar2->SetNextWindowSizeVal).x = 300.0;
        (pIVar2->SetNextWindowSizeVal).y = 300.0;
        pIVar2->SetNextWindowSizeCond = 4;
        local_178.x = 0.0;
        local_178.y = 0.0;
        ImGui::Begin("Coefficients",&main::show_another_window,&local_178,-1.0,0);
        fVar10 = (GImGui->IO).Framerate;
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",
                    SUB84((double)(1000.0 / fVar10),0),SUB84((double)fVar10,0));
        ImGui::End();
        glfwGetFramebufferSize(handle,&local_21c,&local_220);
        (*glad_glViewport)(0,0,local_21c,local_220);
        IVar1 = GImGui->ActiveId;
        if (fpsCameraViewMatrix(GLFWwindow*,float*,bool)::rotation == '\0') {
          main_cold_1();
        }
        glfwGetCursorPos(handle,&local_218,&local_210);
        if ((IVar1 == 0) && (iVar6 = glfwGetMouseButton(handle,0), iVar6 == 1)) {
          _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 =
               (float)(local_210 - _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_1) * -0.2 +
               _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0;
          _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1 =
               (float)(local_218 - _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_0) * -0.2 +
               _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1;
        }
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_0 = local_218;
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE9lastMouse_1 = local_210;
        local_238._0_4_ = _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 * 0.017453292;
        fVar10 = cosf(_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_0 * 0.017453292);
        fVar11 = sinf((float)local_238);
        local_138 = fVar10 + (1.0 - fVar10);
        local_130 = (1.0 - fVar10) * 0.0;
        local_124 = fVar10 + local_130;
        local_120 = local_130 + fVar11;
        local_114 = local_130 - fVar11;
        local_134 = local_130 + fVar11 * 0.0;
        local_130 = local_130 - fVar11 * 0.0;
        local_12c = 0;
        local_11c = 0;
        local_10c = 0;
        uStack_104 = 0;
        local_fc = 0x3f800000;
        local_238._0_4_ = _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8rotation_1 * 0.017453292;
        local_128 = local_130;
        local_118 = local_134;
        local_110 = local_124;
        fVar10 = cosf((float)local_238);
        fVar11 = sinf((float)local_238);
        local_168 = (1.0 - fVar10) * 0.0;
        local_150 = local_168 + fVar10;
        local_170 = local_168 - fVar11;
        local_158 = local_168 + fVar11;
        local_160 = local_168 + fVar11 * 0.0;
        local_178.y = local_160;
        local_178.x = local_150;
        local_16c = 0;
        local_168 = local_168 - fVar11 * 0.0;
        local_164 = (1.0 - fVar10) + fVar10;
        local_15c = 0;
        local_14c = 0;
        uStack_144 = 0;
        local_13c = 0x3f800000;
        local_154 = local_168;
        m_mul44(&local_1b8,&local_178.x,&local_138);
        iVar6 = glfwGetKey(handle,0x154);
        fVar10 = 0.0;
        fVar12 = 0.0;
        fVar11 = 0.0;
        if (IVar1 == 0) {
          iVar7 = glfwGetKey(handle,0x57);
          iVar8 = glfwGetKey(handle,0x53);
          fVar13 = *(float *)(&DAT_00195800 + (ulong)(iVar6 == 1) * 4);
          fVar10 = 0.0 - fVar13;
          local_208 = ZEXT416((uint)fVar10);
          if (iVar7 != 1) {
            fVar10 = 0.0;
          }
          local_224 = fVar13;
          if (iVar8 != 1) {
            local_224 = -0.0;
          }
          iVar6 = glfwGetKey(handle,0x41);
          iVar7 = glfwGetKey(handle,0x44);
          local_238 = local_208._0_8_;
          uStack_230 = local_208._8_8_;
          if (iVar6 != 1) {
            local_238 = 0;
            uStack_230 = 0;
          }
          local_228 = fVar13;
          if (iVar7 != 1) {
            local_228 = -0.0;
          }
          iVar6 = glfwGetKey(handle,0x45);
          if (iVar6 != 1) {
            local_208 = ZEXT816(0);
          }
          iVar6 = glfwGetKey(handle,0x51);
          fVar10 = fVar10 + local_224;
          fVar12 = (float)local_238 + local_228;
          fVar11 = (float)local_208._0_4_;
          if (iVar6 == 1) {
            fVar11 = (float)local_208._0_4_ + fVar13;
          }
        }
        local_238 = CONCAT44(local_238._4_4_,local_1a8);
        local_1f8 = local_1b8;
        local_1f4 = local_1a8;
        local_1f0 = local_198;
        local_1ec = local_188;
        local_1e8 = local_1b4;
        local_1e4 = local_1a4;
        local_1e0 = local_194;
        local_1dc = local_184;
        local_1d8 = local_1b0;
        local_1d4 = local_1a0;
        local_1d0 = local_190;
        local_1cc = local_180;
        local_1c8 = local_1ac;
        local_1c4 = local_19c;
        local_1c0 = local_18c;
        fVar13 = 1.0 / (local_18c * fVar10 + local_1ac * fVar12 + fVar11 * local_19c + local_17c);
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0 =
             (fVar10 * local_198 + fVar12 * local_1b8 + fVar11 * local_1a8 + local_188) * fVar13 +
             _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0;
        local_1bc = local_17c;
        local_f8[0xc] = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_0;
        local_f8[0] = 1.0;
        local_f8[1] = 0.0;
        local_f8[2] = 0.0;
        local_f8[3] = 0.0;
        local_f8[4] = 0.0;
        local_f8[5] = 1.0;
        local_f8[6] = 0.0;
        local_f8[7] = 0.0;
        local_f8[8] = 0.0;
        local_f8[9] = 0.0;
        local_f8[10] = 1.0;
        local_f8[0xb] = 0.0;
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1 =
             (local_194 * fVar10 + local_1b4 * fVar12 + fVar11 * local_1a4 + local_184) * fVar13 +
             _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1;
        local_c4 = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_1;
        _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2 =
             (local_190 * fVar10 + local_1b0 * fVar12 + fVar11 * local_1a0 + local_180) * fVar13 +
             _ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2;
        local_c0 = -_ZZL19fpsCameraViewMatrixP10GLFWwindowPfbE8position_2;
        local_bc = 0x3f800000;
        m_mul44(local_78,&local_1f8,local_f8);
        fVar11 = (float)local_21c;
        fVar10 = (float)local_220;
        local_b8[5] = tanf((FOV * 3.1415927) / 360.0);
        local_b8[5] = 1.0 / local_b8[5];
        local_b8[0] = local_b8[5] / (fVar11 / fVar10);
        local_b8[1] = 0.0;
        local_b8[2] = 0.0;
        local_b8[3] = 0.0;
        local_b8[4] = 0.0;
        local_a0 = 0;
        uStack_98 = 0;
        local_90 = 0xbf800000bf80068e;
        uStack_88 = 0;
        local_80 = 0xbca3db3c;
        (*glad_glClearColor)(0.0,0.0,0.0,1.0);
        (*glad_glClear)(0x4100);
        (*glad_glEnable)(0xb71);
        (*glad_glDepthFunc)(0x203);
        (*glad_glUseProgram)(local_268.program);
        (*glad_glUniformMatrix4fv)(local_268.u_projection,1,'\0',local_b8);
        (*glad_glUniformMatrix4fv)(local_268.u_view,1,'\0',local_78);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_sh_lut");
        (*p_Var4)(GVar9,3);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_log_lut");
        (*p_Var4)(GVar9,1);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_ab_lut");
        (*p_Var4)(GVar9,2);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_sphere");
        (*p_Var4)(GVar9,4);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_ratio");
        (*p_Var4)(GVar9,5);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_sparse");
        (*p_Var4)(GVar9,0xf);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_sqrsparse");
        (*p_Var4)(GVar9,0x10);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_LH");
        (*p_Var4)(GVar9,8);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"u_LHcubemap");
        (*p_Var4)(GVar9,0);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"albedo_map");
        (*p_Var4)(GVar9,0x14);
        p_Var3 = glad_glUniform1f;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"max_magn");
        (*p_Var3)(GVar9,local_268.max_magn);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"gammasize");
        (*p_Var4)(GVar9,local_268.gammasize);
        p_Var4 = glad_glUniform1i;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"sqrgammasize");
        (*p_Var4)(GVar9,local_268.sqrgammasize);
        p_Var5 = glad_glUniform3fv;
        GVar9 = (*glad_glGetUniformLocation)(local_268.program,"objcolor");
        (*p_Var5)(GVar9,10,&obj_color[0].x);
        (*glad_glBindVertexArray)(local_268.vao);
        (*glad_glDrawArrays)(4,0,local_268.vertices);
        if (argc < 2) {
          ImGui::Render();
        }
        glfwSwapBuffers(handle);
        if (1 < argc) {
          saveImage("window_save.png",handle);
          goto LAB_0015d7f1;
        }
        std::chrono::_V2::system_clock::now();
      } while( true );
    }
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	console.info("SH order:", shorder);
	console.info("shexp method:", SHEXP_METHOD);
	bool single_image_mode = (argc>1);
	if (single_image_mode) {
		console.warn("single image mode");
	}
	try {
	glfwSetErrorCallback(error_callback);
	if (!glfwInit()) return 1;
	glfwWindowHint(GLFW_RED_BITS, 8);
	glfwWindowHint(GLFW_GREEN_BITS, 8);
	glfwWindowHint(GLFW_BLUE_BITS, 8);
	glfwWindowHint(GLFW_ALPHA_BITS, 8);
	glfwWindowHint(GLFW_DEPTH_BITS, 32);
	glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
	glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);
	glfwWindowHint(GLFW_SAMPLES, 4);
	glfwWindowHint(GLFW_RESIZABLE, GLFW_FALSE);
	GLFWwindow *window = glfwCreateWindow(960, 540, "Spherical Harmonics Playground", NULL, NULL);
	if (!window) return 1;
	glfwMakeContextCurrent(window);
	gladLoadGLLoader((GLADloadproc)glfwGetProcAddress);
	glfwSwapInterval(0); // vsync disabled

	ImGui_ImplGlfwGL3_Init(window, true);

	scene_t scene = {0};
	initScene(&scene);
	// display_texture::init();
	auto lasttime = std::chrono::system_clock::now();
	bool firstframe = true;

	while (!glfwWindowShouldClose(window))
	{
		glfwPollEvents();
		if (glfwGetKey(window, GLFW_KEY_R) == GLFW_PRESS)
		{
			destroyScene(&scene);
			initScene(&scene);
		}
		ImGui_ImplGlfwGL3_NewFrame();

		ImGui::SetNextWindowSize(ImVec2(300, 300), ImGuiSetCond_FirstUseEver);
		static bool show_another_window = true;
		ImGui::Begin("Coefficients", &show_another_window);
		// for (int i = 0; i < 9; i++)
		// {
		// 	char name[] = "[?]";
		// 	name[1] = i + '0';
		// 	m_vec3 remapped = m_scale3(m_add3(scene.mesh.coefficients[i], m_v3(1.0f, 1.0f, 1.0f)), 0.5f);
		// 	ImGui::ColorEdit3(name, &remapped.x);
		// 	scene.mesh.coefficients[i] = m_sub3(m_scale3(remapped, 2.0f), m_v3(1.0f, 1.0f, 1.0f));
		// }
		ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
		ImGui::End();

		int w, h;
		glfwGetFramebufferSize(window, &w, &h);
		glViewport(0, 0, w, h);
		float view[16], projection[16];
		fpsCameraViewMatrix(window, view, ImGui::IsAnyItemActive());
		m_perspective44(projection, FOV, (float)w / (float)h, 0.01f, 100.0f);
		// console.warn("perspective");
		// for (int i=0; i<16; ++i)
		// 	console.log(projection[i]);
		drawScene(&scene, view, projection);
		// display_texture::draw();
		if (!single_image_mode) {
			ImGui::Render();
		}
		glfwSwapBuffers(window);
		if (single_image_mode) {
			saveImage("window_save.png", window);
			break;
		}
		// framerate
		auto now = std::chrono::system_clock::now();
		if (firstframe) {
			firstframe = false;
		}
		else {
			std::chrono::duration<double> seconds = now - lasttime;
			// console.log("frame draw time:", seconds.count());
		}
		lasttime = now;
	}

	destroyScene(&scene);
	ImGui_ImplGlfwGL3_Shutdown();
	glfwDestroyWindow(window);
	glfwTerminate();
	}
	catch (const char* e) {
		console.error(e);
		return 1;
	}
}